

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O2

void tonk::MakeCallbacksOptional(TonkConnectionConfig *config)

{
  if (config->OnConnect == (_func_void_TonkAppContextPtr_TonkConnection *)0x0) {
    config->OnConnect = MakeCallbacksOptional::anon_class_1_0_00000001::__invoke;
  }
  if (config->OnData ==
      (_func_void_TonkAppContextPtr_TonkConnection_uint32_t_uint8_t_ptr_uint32_t *)0x0) {
    config->OnData = MakeCallbacksOptional::anon_class_1_0_00000001::__invoke;
  }
  if (config->OnTick == (_func_void_TonkAppContextPtr_TonkConnection_uint64_t *)0x0) {
    config->OnTick = MakeCallbacksOptional::anon_class_1_0_00000001::__invoke;
  }
  if (config->OnClose != (_func_void_TonkAppContextPtr_TonkConnection_TonkResult_char_ptr *)0x0) {
    return;
  }
  config->OnClose = MakeCallbacksOptional::anon_class_1_0_00000001::__invoke;
  return;
}

Assistant:

void MakeCallbacksOptional(TonkConnectionConfig& config)
{
    if (!config.OnConnect)
    {
        config.OnConnect = [](
            TonkAppContextPtr /*context*/,
            TonkConnection /*connection*/)
        {
            // No-op
        };
    }
    if (!config.OnData)
    {
        config.OnData = [](
            TonkAppContextPtr /*context*/,
            TonkConnection /*connection*/,
            unsigned          /*channel*/,
            const uint8_t*       /*data*/,
            unsigned            /*bytes*/)
        {
            // No-op
        };
    }
    if (!config.OnTick)
    {
        config.OnTick = [](
            TonkAppContextPtr /*context*/,
            TonkConnection /*connection*/,
            uint64_t /*nowUsec*/)
        {
            // No-op
        };
    }
    if (!config.OnClose)
    {
        config.OnClose = [](
            TonkAppContextPtr /*context*/,
            TonkConnection /*connection*/,
            TonkResult         /*reason*/,
            const char*    /*reasonJson*/)
        {
            // No-op
        };
    }
}